

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O2

void __thiscall
ArgParser::add(ArgParser *this,uint *var,string *name,string *shortName,string *description,uint mn,
              uint mx,bool optional)

{
  pointer pAVar1;
  int iVar2;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  std::__cxx11::string::string((string *)&local_70,(string *)shortName);
  std::__cxx11::string::string((string *)&local_90,(string *)description);
  add(this,var,&local_50,&local_70,&local_90,optional);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pAVar1 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = (int)(((long)(this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0xe0) + -1;
  pAVar1[iVar2].minUINT = mn;
  pAVar1[iVar2].maxUINT = mx;
  pAVar1[iVar2].checkRange = true;
  return;
}

Assistant:

void ArgParser::add(unsigned int *var,
                    std::string name, std::string shortName, std::string description,
                    unsigned int mn, unsigned int mx,
                    bool optional)
{
    add(var, name, shortName, description, optional);
    int ind = m_args.size() - 1;
    m_args[ind].minUINT = mn;
    m_args[ind].maxUINT = mx;
    m_args[ind].checkRange = true;
}